

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall
btQuantizedBvh::reportBoxCastOverlappingNodex
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,btVector3 *raySource,
          btVector3 *rayTarget,btVector3 *aabbMin,btVector3 *aabbMax)

{
  long in_RDI;
  btVector3 *in_stack_000000b8;
  btVector3 *in_stack_000000c0;
  btVector3 *in_stack_000000c8;
  btVector3 *in_stack_000000d0;
  btVector3 *in_stack_000000d8;
  btQuantizedBvh *in_stack_000000e0;
  btVector3 *in_stack_000000e8;
  int in_stack_000000f0;
  undefined4 in_stack_000000f4;
  int in_stack_000000f8;
  undefined4 in_stack_000000fc;
  btQuantizedBvh *in_stack_00000100;
  int in_stack_00000110;
  int in_stack_00000118;
  
  if ((*(byte *)(in_RDI + 0x40) & 1) == 0) {
    walkStacklessTreeAgainstRay
              (in_stack_000000e0,(btNodeOverlapCallback *)in_stack_000000d8,in_stack_000000d0,
               in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000f0,
               in_stack_000000f8);
  }
  else {
    walkStacklessQuantizedTreeAgainstRay
              (in_stack_00000100,
               (btNodeOverlapCallback *)CONCAT44(in_stack_000000fc,in_stack_000000f8),
               (btVector3 *)CONCAT44(in_stack_000000f4,in_stack_000000f0),in_stack_000000e8,
               (btVector3 *)in_stack_000000e0,in_stack_000000d8,in_stack_00000110,in_stack_00000118)
    ;
  }
  return;
}

Assistant:

void	btQuantizedBvh::reportBoxCastOverlappingNodex(btNodeOverlapCallback* nodeCallback, const btVector3& raySource, const btVector3& rayTarget, const btVector3& aabbMin,const btVector3& aabbMax) const
{
	//always use stackless

	if (m_useQuantization)
	{
		walkStacklessQuantizedTreeAgainstRay(nodeCallback, raySource, rayTarget, aabbMin, aabbMax, 0, m_curNodeIndex);
	}
	else
	{
		walkStacklessTreeAgainstRay(nodeCallback, raySource, rayTarget, aabbMin, aabbMax, 0, m_curNodeIndex);
	}
	/*
	{
		//recursive traversal
		btVector3 qaabbMin = raySource;
		btVector3 qaabbMax = raySource;
		qaabbMin.setMin(rayTarget);
		qaabbMax.setMax(rayTarget);
		qaabbMin += aabbMin;
		qaabbMax += aabbMax;
		reportAabbOverlappingNodex(nodeCallback,qaabbMin,qaabbMax);
	}
	*/

}